

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O2

double declaration(bool is_const)

{
  bool bVar1;
  Token t2;
  string name;
  Token t;
  allocator<char> local_b9;
  double local_b8;
  undefined1 local_b0 [48];
  string local_80;
  string local_60;
  undefined1 local_40 [48];
  
  Token_stream::get((Token *)local_40,&ts);
  if (local_40[0] != 'a') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,"name expected in declaration",(allocator<char> *)&local_80);
    error((string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
  }
  std::__cxx11::string::string((string *)&local_80,(string *)(local_40 + 0x10));
  bVar1 = Symbol_table::is_declared(&st,&local_80);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0," declared twice",(allocator<char> *)&local_60);
    error(&local_80,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
  }
  Token_stream::get((Token *)local_b0,&ts);
  if (local_b0[0] != (string)0x3d) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"= missing in declaration of ",&local_b9);
    error(&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  local_b8 = expression();
  Symbol_table::define_name(&st,&local_80,local_b8,is_const);
  std::__cxx11::string::~string((string *)(local_b0 + 0x10));
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return local_b8;
}

Assistant:

double declaration(bool is_const = false)
{
	Token t = ts.get();
	if (t.kind != name)
		error("name expected in declaration");
	string name = t.name;
	if (st.is_declared(name))
		error(name, " declared twice");
	Token t2 = ts.get();
	if (t2.kind != '=')
		error("= missing in declaration of ", name);
	double d = expression();
	st.define_name(name, d, is_const);
	return d;
}